

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

int __thiscall
ft::list<int,_ft::allocator<int>_>::remove(list<int,_ft::allocator<int>_> *this,char *__filename)

{
  listNode<int> *plVar1;
  listNode<int> *plVar2;
  node *pnVar3;
  node *extraout_RAX;
  listNode<int> *plVar4;
  
  pnVar3 = this->m_head;
  plVar4 = pnVar3->next;
  if (plVar4 != this->m_tail) {
    do {
      pnVar3 = (node *)(ulong)(uint)plVar4->data;
      plVar2 = plVar4->next;
      if (plVar4->data == *(uint *)__filename) {
        plVar1 = plVar4->prev;
        plVar1->next = plVar4->next;
        plVar2 = plVar4->next;
        plVar2->prev = plVar1;
        operator_delete(plVar4);
        this->m_size = this->m_size - 1;
        pnVar3 = extraout_RAX;
      }
      plVar4 = plVar2;
    } while (plVar4 != this->m_tail);
  }
  return (int)pnVar3;
}

Assistant:

void remove(value_type const & val) {
		iterator	it = this->begin();
		while (it != this->end()) {
			if (*it == val)
				it = this->erase(it);
			else
				++it;
		}
	}